

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O1

Own<capnp::PipelineHook,_std::nullptr_t> __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::PostReturnRpcPipeline::addRef
          (PostReturnRpcPipeline *this)

{
  uint *puVar1;
  PipelineHook *in_RDX;
  Disposer *in_RDI;
  Own<capnp::PipelineHook,_std::nullptr_t> OVar2;
  
  puVar1 = &(this->super_Refcounted).refcount;
  *puVar1 = *puVar1 + 1;
  in_RDI->_vptr_Disposer = (_func_int **)&this->super_Refcounted;
  in_RDI[1]._vptr_Disposer = (_func_int **)this;
  OVar2.ptr = in_RDX;
  OVar2.disposer = in_RDI;
  return OVar2;
}

Assistant:

kj::Own<PipelineHook> addRef() override {
      return kj::addRef(*this);
    }